

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O0

void __thiscall
solitaire::SolitaireHandWithOneCardTest_tryPutCardsBack_Test::TestBody
          (SolitaireHandWithOneCardTest_tryPutCardsBack_Test *this)

{
  bool bVar1;
  StrictMock<solitaire::archivers::MoveCardsOperationSnapshotCreatorMock> *__return_storage_ptr__;
  MockSpec<void_()> *this_00;
  Cards *this_01;
  char *message;
  MoveCardsOperationSnapshotCreatorMock *in_RSI;
  Solitaire *this_02;
  char *in_R9;
  string local_80;
  AssertHelper local_60;
  Message local_58 [3];
  bool local_39;
  undefined1 local_38 [8];
  AssertionResult gtest_ar_;
  MockSpec<void_()> local_20;
  SolitaireHandWithOneCardTest_tryPutCardsBack_Test *local_10;
  SolitaireHandWithOneCardTest_tryPutCardsBack_Test *this_local;
  
  local_10 = this;
  __return_storage_ptr__ =
       mock_ptr<testing::StrictMock<solitaire::archivers::MoveCardsOperationSnapshotCreatorMock>_>::
       operator*(&(this->super_SolitaireHandWithOneCardTest).super_SolitaireEmptyHandTest.
                  super_SolitaireTest.moveCardsOperationSnapshotCreatorMock);
  local_20.function_mocker_ =
       (FunctionMocker<void_()> *)
       archivers::MoveCardsOperationSnapshotCreatorMock::gmock_restoreSourcePile
                 ((MockSpec<void_()> *)__return_storage_ptr__,in_RSI);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<void_()>::operator()
                      (&local_20,
                       (WithoutMatchers *)
                       ((long)&gtest_ar_.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       + 7),(void *)0x0);
  testing::internal::MockSpec<void_()>::InternalExpectedAt
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
             ,0x1b6,"*moveCardsOperationSnapshotCreatorMock","restoreSourcePile()");
  this_02 = &(this->super_SolitaireHandWithOneCardTest).super_SolitaireEmptyHandTest.
             super_SolitaireTest.solitaire;
  Solitaire::tryPutCardsBackFromHand(this_02);
  this_01 = Solitaire::getCardsInHand(this_02);
  local_39 = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::empty
                       (this_01);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_38,&local_39,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(internal *)local_38,
               (AssertionResult *)"solitaire.getCardsInHand().empty()","false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
               ,0x1b8,message);
    testing::internal::AssertHelper::operator=(&local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  return;
}

Assistant:

TEST_F(SolitaireHandWithOneCardTest, tryPutCardsBack) {
    EXPECT_CALL(*moveCardsOperationSnapshotCreatorMock, restoreSourcePile());
    solitaire.tryPutCardsBackFromHand();
    EXPECT_TRUE(solitaire.getCardsInHand().empty());
}